

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.hpp
# Opt level: O1

void __thiscall boost::deflate::deflate_stream::deflate_stream(deflate_stream *this)

{
  lut_type *plVar1;
  
  plVar1 = detail::deflate_stream::get_lut();
  (this->super_deflate_stream).lut_ = plVar1;
  (this->super_deflate_stream).inited_ = false;
  (this->super_deflate_stream).buf_._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  (this->super_deflate_stream).last_flush_.super_type.m_initialized = false;
  (this->super_deflate_stream).window_ = (Byte *)0x0;
  detail::deflate_stream::doReset(&this->super_deflate_stream,6,0xf,9,normal,none);
  return;
}

Assistant:

deflate_stream()
    {
        reset(6, 15, default_mem_level, Strategy::normal,boost::deflate::wrap::none);
    }